

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O3

void __thiscall
cmdline::parser::option_without_value::option_without_value
          (option_without_value *this,string *name,char short_name,string *desc)

{
  pointer pcVar1;
  
  (this->super_option_base)._vptr_option_base = (_func_int **)&PTR__option_without_value_00120960;
  (this->nam)._M_dataplus._M_p = (pointer)&(this->nam).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->nam,pcVar1,pcVar1 + name->_M_string_length);
  this->snam = short_name;
  (this->desc)._M_dataplus._M_p = (pointer)&(this->desc).field_2;
  pcVar1 = (desc->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->desc,pcVar1,pcVar1 + desc->_M_string_length);
  this->has = false;
  return;
}

Assistant:

option_without_value(const std::string& name, char short_name, const std::string& desc)
            : nam(name), snam(short_name), desc(desc), has(false) {}